

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::filter_impl<unsigned_short>::filter_impl(filter_impl<unsigned_short> *this)

{
  _Rb_tree_header *p_Var1;
  range rStack_18;
  
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  range::range(&rStack_18,0,0);
  ::std::
  _Rb_tree<libtorrent::aux::filter_impl<unsigned_short>::range,_libtorrent::aux::filter_impl<unsigned_short>::range,_std::_Identity<libtorrent::aux::filter_impl<unsigned_short>::range>,_std::less<libtorrent::aux::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::aux::filter_impl<unsigned_short>::range>_>
  ::_M_insert_unique<libtorrent::aux::filter_impl<unsigned_short>::range>
            ((_Rb_tree<libtorrent::aux::filter_impl<unsigned_short>::range,_libtorrent::aux::filter_impl<unsigned_short>::range,_std::_Identity<libtorrent::aux::filter_impl<unsigned_short>::range>,_std::less<libtorrent::aux::filter_impl<unsigned_short>::range>,_std::allocator<libtorrent::aux::filter_impl<unsigned_short>::range>_>
              *)this,&rStack_18);
  return;
}

Assistant:

filter_impl<Addr>::filter_impl()
	{
		// make the entire ip-range non-blocked
		m_access_list.insert(range(zero<Addr>(), 0));
	}